

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ciphercommon_hw.c
# Opt level: O0

int ossl_cipher_hw_generic_cfb8(PROV_CIPHER_CTX *dat,uchar *out,uchar *in,size_t len)

{
  uchar *in_RCX;
  void *in_RDX;
  size_t in_RSI;
  uchar *in_RDI;
  uchar *unaff_retaddr;
  int in_stack_00000010;
  int num;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  
  uVar1 = *(undefined4 *)(in_RDI + 0x70);
  CRYPTO_cfb128_8_encrypt
            (unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX,
             (int *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),in_stack_00000010,(block128_f)len);
  *(undefined4 *)(in_RDI + 0x70) = uVar1;
  return 1;
}

Assistant:

int ossl_cipher_hw_generic_cfb8(PROV_CIPHER_CTX *dat, unsigned char *out,
                                const unsigned char *in, size_t len)
{
    int num = dat->num;

    CRYPTO_cfb128_8_encrypt(in, out, len, dat->ks, dat->iv, &num, dat->enc,
                            dat->block);
    dat->num = num;

    return 1;
}